

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::SubroutineIndexNegativeLinkMaxIndex::Run
          (SubroutineIndexNegativeLinkMaxIndex *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> _index;
  DefOccurence local_33c;
  LayoutSpecifierBase local_338;
  LayoutSpecifierBase local_328;
  SubroutineUniform local_318;
  undefined1 local_1b0 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunction local_158;
  undefined1 local_50 [8];
  SubroutineFunctionSet functions_st0;
  GLint max;
  SubroutineIndexNegativeLinkMaxIndex *this_local;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8de7,
             (GLint *)(functions_st0.typeName.field_2._M_local_buf + 0xc));
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet((SubroutineFunctionSet *)local_50,generator,0);
  _index = LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C
                     (functions_st0.typeName.field_2._12_4_,Dec);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = _index.super_LayoutSpecifierBase._0_8_;
  SubroutineFunction::SubroutineFunction
            (&local_158,generator,(Index)_index.super_LayoutSpecifierBase);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_50,&local_158);
  SubroutineFunction::~SubroutineFunction(&local_158);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_1b0);
  local_338 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_328 = local_338;
  DefOccurence::DefOccurence(&local_33c,FSH_OR_CSH);
  SubroutineUniform::SubroutineUniform
            (&local_318,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_50,(Loc)local_328,0,local_33c,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_1b0,&local_318);
  SubroutineUniform::~SubroutineUniform(&local_318);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_1b0);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_1b0);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_50);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		GLint max;
		glGetIntegerv(GL_MAX_SUBROUTINES, &max);

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = N) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(max)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit(), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}